

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O3

void * worker_thread_put(void *arg)

{
  int iVar1;
  void *extraout_RAX;
  void *pvVar2;
  undefined4 extraout_var_00;
  long lVar3;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar4;
  os_thread_t *thread_00;
  ulong uVar6;
  void *arg_00;
  ulong uVar7;
  double dVar8;
  undefined1 local_58 [8];
  benchmark_time_t t2;
  benchmark_time_t tdiff;
  benchmark_time_t t1;
  undefined4 extraout_var;
  undefined8 uVar5;
  
  uVar6 = (ulong)(uint)(*(int *)((long)arg + 0x1c) * *arg);
  benchmark_time_get((benchmark_time_t *)&tdiff.tv_nsec);
  t1.tv_nsec = uVar6;
  if (*(int *)((long)arg + 0x1c) != 0) {
    do {
      uVar5 = *(undefined8 *)((long)arg + 8);
      lVar3 = ((ulong)t1.tv_nsec % (ulong)*(uint *)((long)arg + 0x18)) * 0x10;
      thread = (os_thread_t *)&t1.tv_nsec;
      iVar1 = vmemcache_put(uVar5,&t1.tv_nsec,8,
                            *(undefined8 *)(*(long *)((long)arg + 0x10) + 8 + lVar3),
                            *(undefined8 *)(*(long *)((long)arg + 0x10) + lVar3));
      uVar4 = (uint)uVar5;
      if (iVar1 != 0) {
        worker_thread_put_cold_1();
        pvVar2 = extraout_RAX;
        if (uVar4 != 0) {
          uVar7 = (ulong)uVar4;
          thread_00 = thread;
          uVar6 = uVar7;
          arg_00 = extraout_RDX;
          do {
            iVar1 = os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                                     *(_func_void_ptr_void_ptr **)((long)arg_00 + 0x28),arg_00);
            pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
            thread_00 = thread_00 + 1;
            arg_00 = (void *)((long)arg_00 + 0x30);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          if (uVar4 != 0) {
            do {
              iVar1 = os_thread_join(thread,(void **)0x0);
              pvVar2 = (void *)CONCAT44(extraout_var_00,iVar1);
              thread = thread + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
        }
        return pvVar2;
      }
      t1.tv_nsec = t1.tv_nsec + 1;
    } while ((ulong)t1.tv_nsec < *(uint *)((long)arg + 0x1c) + uVar6);
  }
  benchmark_time_get((benchmark_time_t *)local_58);
  benchmark_time_diff((benchmark_time_t *)&t2.tv_nsec,(benchmark_time_t *)&tdiff.tv_nsec,
                      (benchmark_time_t *)local_58);
  dVar8 = benchmark_time_get_secs((benchmark_time_t *)&t2.tv_nsec);
  *(double *)((long)arg + 0x20) = dVar8;
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_put(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;
	unsigned long long shift = ctx->thread_number * ctx->ops_count;
	benchmark_time_t t1, t2, tdiff;

	benchmark_time_get(&t1);

	for (i = shift; i < (shift + ctx->ops_count); i++) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
				ctx->buffs[i % ctx->nbuffs].buff,
				ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	benchmark_time_get(&t2);
	benchmark_time_diff(&tdiff, &t1, &t2);
	ctx->secs = benchmark_time_get_secs(&tdiff);

	return NULL;
}